

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

void __thiscall uv::TCPClient::send_inl(TCPClient *this,uv_write_t *req)

{
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  reference pp_Var3;
  ssize_t sVar4;
  CStringStream *pCVar5;
  ILog4zManager *pIVar6;
  undefined8 uVar7;
  TCPClient *in_RCX;
  long *in_FS_OFFSET;
  string local_60;
  undefined1 local_40 [8];
  CStringStream ss;
  write_param *pwStack_20;
  int iret;
  write_param *writep;
  uv_write_t *req_local;
  TCPClient *this_local;
  
  pwStack_20 = (write_param *)req;
  writep = (write_param *)req;
  req_local = (uv_write_t *)this;
  if (req != (uv_write_t *)0x0) {
    sVar2 = std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::size
                      (&this->writeparam_list_);
    if (sVar2 < 0x15) {
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
                (&this->writeparam_list_,&stack0xffffffffffffffe0);
    }
    else {
      FreeWriteParam(pwStack_20);
    }
  }
  while( true ) {
    uv_mutex_lock(&this->mutex_writebuf_);
    bVar1 = PodCircularBuffer<char>::empty(&this->write_circularbuf_);
    if (bVar1) break;
    bVar1 = std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::empty
                      (&this->writeparam_list_);
    if (bVar1) {
      pwStack_20 = AllocWriteParam();
      (pwStack_20->write_req_).data = this;
      in_RCX = this;
    }
    else {
      pp_Var3 = std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::front
                          (&this->writeparam_list_);
      pwStack_20 = *pp_Var3;
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::pop_front
                (&this->writeparam_list_);
    }
    sVar4 = PodCircularBuffer<char>::read
                      (&this->write_circularbuf_,(int)(pwStack_20->buf_).base,
                       (void *)(ulong)(uint)pwStack_20->buf_truelen_,(size_t)in_RCX);
    (pwStack_20->buf_).len = (long)(int)sVar4;
    uv_mutex_unlock(&this->mutex_writebuf_);
    in_RCX = (TCPClient *)0x1;
    ss.m_pCur._4_4_ = uv_write(pwStack_20,this->client_handle_,&pwStack_20->buf_,1,AfterSend);
    if (ss.m_pCur._4_4_ != 0) {
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
                (&this->writeparam_list_,&stack0xffffffffffffffe0);
      zsummer::log4z::CStringStream::CStringStream
                ((CStringStream *)local_40,(char *)(*in_FS_OFFSET + -0x800),0x800);
      pCVar5 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40,"client(");
      pCVar5 = zsummer::log4z::CStringStream::operator<<(pCVar5,this);
      pCVar5 = zsummer::log4z::CStringStream::operator<<(pCVar5,") send error:");
      GetUVError_abi_cxx11_(&local_60,ss.m_pCur._4_4_);
      zsummer::log4z::CStringStream::operator<<(pCVar5,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      pCVar5 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40," ( ");
      pCVar5 = zsummer::log4z::CStringStream::operator<<(pCVar5," ");
      pCVar5 = zsummer::log4z::CStringStream::operator<<(pCVar5," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar5,0x1e9);
      pIVar6 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar6->_vptr_ILog4zManager[8])(pIVar6,0,3,*in_FS_OFFSET + -0x800);
      __stream = _stdout;
      uVar7 = uv_err_name(ss.m_pCur._4_4_);
      in_RCX = (TCPClient *)uv_strerror(ss.m_pCur._4_4_);
      fprintf(__stream,"send error. %s-%s\n",uVar7);
    }
  }
  uv_mutex_unlock(&this->mutex_writebuf_);
  return;
}

Assistant:

void TCPClient::send_inl(uv_write_t* req /*= NULL*/)
{
    write_param* writep = (write_param*)req;
    if (writep) {
        if (writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam(writep);
        } else {
            writeparam_list_.push_back(writep);
        }
    }
    while (true) {
        uv_mutex_lock(&mutex_writebuf_);
        if (write_circularbuf_.empty()) {
            uv_mutex_unlock(&mutex_writebuf_);
            break;
        }
        if (writeparam_list_.empty()) {
            writep = AllocWriteParam();
            writep->write_req_.data = this;
        } else {
            writep = writeparam_list_.front();
            writeparam_list_.pop_front();
        }
        writep->buf_.len = write_circularbuf_.read(writep->buf_.base, writep->buf_truelen_); 
        uv_mutex_unlock(&mutex_writebuf_);
        int iret = uv_write((uv_write_t*)&writep->write_req_, (uv_stream_t*)&client_handle_->tcphandle, &writep->buf_, 1, AfterSend);
        if (iret) {
            writeparam_list_.push_back(writep);//failure not call AfterSend. so recycle req
            LOGE("client(" << this << ") send error:" << GetUVError(iret));
            fprintf(stdout, "send error. %s-%s\n", uv_err_name(iret), uv_strerror(iret));
        }
    }
}